

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLNode * __thiscall tinyxml2::XMLNode::DeepClone(XMLNode *this,XMLDocument *target)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *addThis;
  XMLNode *this_01;
  XMLNode *this_00;
  
  iVar1 = (*this->_vptr_XMLNode[0xc])();
  this_00 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  if (this_00 == (XMLNode *)0x0) {
    this_00 = (XMLNode *)0x0;
  }
  else {
    for (this_01 = this->_firstChild; this_01 != (XMLNode *)0x0; this_01 = this_01->_next) {
      addThis = DeepClone(this_01,target);
      InsertEndChild(this_00,addThis);
    }
  }
  return this_00;
}

Assistant:

XMLNode* XMLNode::DeepClone(XMLDocument* target) const
{
	XMLNode* clone = this->ShallowClone(target);
	if (!clone) return 0;

	for (const XMLNode* child = this->FirstChild(); child; child = child->NextSibling()) {
		XMLNode* childClone = child->DeepClone(target);
		TIXMLASSERT(childClone);
		clone->InsertEndChild(childClone);
	}
	return clone;
}